

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.h
# Opt level: O2

Vec3 __thiscall cert::World::light_hit(World *this,Vec3 point,Vec3 normal)

{
  Light *pLVar1;
  bool bVar2;
  uint uVar3;
  float extraout_var;
  int i;
  ulong uVar4;
  float t_max;
  undefined8 extraout_XMM0_Qa;
  Vec3 VVar5;
  float local_90;
  undefined8 local_88;
  float local_78;
  float fStack_74;
  Ray local_68;
  undefined8 local_50;
  float local_48;
  Vec3 local_40;
  
  local_48 = normal.z;
  local_50 = normal._0_8_;
  local_40.z = point.z;
  local_40._0_8_ = point._0_8_;
  local_90 = 0.0;
  local_88 = 0;
  for (uVar4 = 0; uVar4 < (this->lights).m_size; uVar4 = uVar4 + 1) {
    pLVar1 = (this->lights).m_data[uVar4];
    uVar3 = (*pLVar1->_vptr_Light[2])(pLVar1,&local_40,&local_50);
    if ((uVar3 & 1) != 0) {
      local_68.origin = operator-(&(this->lights).m_data[uVar4]->position,&local_40);
      t_max = Vec3::length(&local_68.origin);
      Light::ray_to_light(&local_68,(this->lights).m_data[uVar4],&local_40);
      bVar2 = intersects(this,&local_68,0.001,t_max);
      if (!bVar2) {
        local_78 = (float)extraout_XMM0_Qa;
        fStack_74 = (float)((ulong)extraout_XMM0_Qa >> 0x20);
        local_88 = CONCAT44(local_88._4_4_ + local_78,(float)local_88 + extraout_var);
        local_90 = local_90 + fStack_74;
      }
    }
  }
  VVar5.z = local_90;
  VVar5.x = (float)local_88;
  VVar5.y = local_88._4_4_;
  return VVar5;
}

Assistant:

constexpr Vec3 light_hit (Vec3 point, Vec3 normal) const
	{
		Vec3 attenuation = VEC3_ZERO;
		for (int i = 0; i < lights.size (); i++)
		{
			auto rec = lights.at (i)->visible (point, normal);
			if (rec.visible)
			{
				float distance = (lights.at (i)->position - point).length ();
				if (!intersects (lights.at (i)->ray_to_light (point), 0.001, distance))
				{
					attenuation += rec.attenuation;
				}
			}
		}
		return attenuation;
	}